

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__update_info_from_resize(stbir__info *info,STBIR_RESIZE *resize)

{
  int iVar1;
  int iVar2;
  stbir__decode_pixels_func *psVar3;
  stbir__encode_pixels_func *psVar4;
  stbir_datatype sVar5;
  stbir_datatype sVar6;
  ulong uVar7;
  stbir__decode_pixels_func **ppsVar8;
  ulong uVar9;
  stbir__encode_pixels_func **ppsVar10;
  stbir__decode_pixels_func *(*papsVar11) [2];
  stbir__encode_pixels_func *(*papsVar12) [2];
  
  sVar5 = resize->input_data_type;
  sVar6 = resize->output_data_type;
  info->input_data = resize->input_pixels;
  iVar1 = resize->input_stride_in_bytes;
  info->input_stride_bytes = iVar1;
  iVar2 = resize->output_stride_in_bytes;
  info->output_stride_bytes = iVar2;
  if (((info->horizontal).filter_enum == STBIR_FILTER_POINT_SAMPLE) &&
     ((sVar6 - STBIR_TYPE_UINT8_SRGB < 2 && sVar5 - STBIR_TYPE_UINT8_SRGB < 2) &&
      (info->vertical).filter_enum == STBIR_FILTER_POINT_SAMPLE)) {
    sVar6 = STBIR_TYPE_UINT8;
    sVar5 = STBIR_TYPE_UINT8;
  }
  if (iVar1 == 0) {
    info->input_stride_bytes =
         (uint)"\x01\x01\x01\x02\x04\x02"[sVar5] *
         (info->horizontal).scale_info.input_full_size * info->channels;
  }
  if (iVar2 == 0) {
    info->output_stride_bytes =
         (uint)"\x01\x01\x01\x02\x04\x02"[sVar6] *
         (info->horizontal).scale_info.output_sub_size * info->channels;
  }
  info->output_data =
       (void *)((long)resize->output_pixels +
               (ulong)"\x01\x01\x01\x02\x04\x02"[sVar6] *
               (long)info->channels * (long)info->offset_x +
               (long)resize->output_stride_in_bytes * (long)info->offset_y);
  info->in_pixels_cb = resize->input_cb;
  info->user_data = resize->user_data;
  info->out_pixels_cb = resize->output_cb;
  if ((sVar5 == STBIR_TYPE_UINT16) || (sVar5 == STBIR_TYPE_UINT8)) {
    if ((info->alpha_weight == (undefined1 *)0x0) && (info->alpha_unweight == (undefined1 *)0x0)) {
      uVar7 = (ulong)(sVar6 == STBIR_TYPE_UINT16 && sVar5 == STBIR_TYPE_UINT16 ||
                     sVar5 == STBIR_TYPE_UINT8 && sVar6 == STBIR_TYPE_UINT8);
    }
    else {
      uVar7 = 0;
    }
    if (info->input_pixel_layout_internal < STBIRI_RGBA) {
      uVar9 = (ulong)(sVar5 == STBIR_TYPE_UINT16) << 4;
      papsVar11 = stbir__update_info_from_resize::decode_simple_scaled_or_not;
    }
    else {
      uVar9 = (ulong)(((info->input_pixel_layout_internal - STBIRI_RGBA) % 6) * 0x20);
      papsVar11 = stbir__update_info_from_resize::decode_alphas_scaled_or_not[0] +
                  (sVar5 == STBIR_TYPE_UINT16);
    }
    ppsVar8 = (stbir__decode_pixels_func **)((long)*papsVar11 + uVar7 * 8 + uVar9);
  }
  else if (info->input_pixel_layout_internal < STBIRI_RGBA) {
    ppsVar8 = stbir__update_info_from_resize::decode_simple + (sVar5 - STBIR_TYPE_UINT8_SRGB);
  }
  else {
    ppsVar8 = stbir__update_info_from_resize::decode_alphas
              [(info->input_pixel_layout_internal - STBIRI_RGBA) % 6] +
              (sVar5 - STBIR_TYPE_UINT8_SRGB);
  }
  psVar3 = *ppsVar8;
  if ((sVar6 == STBIR_TYPE_UINT16) || (sVar6 == STBIR_TYPE_UINT8)) {
    if ((info->alpha_weight == (undefined1 *)0x0) && (info->alpha_unweight == (undefined1 *)0x0)) {
      uVar7 = (ulong)(sVar5 == STBIR_TYPE_UINT16 && sVar6 == STBIR_TYPE_UINT16 ||
                     sVar6 == STBIR_TYPE_UINT8 && sVar5 == STBIR_TYPE_UINT8);
    }
    else {
      uVar7 = 0;
    }
    if (info->output_pixel_layout_internal < STBIRI_RGBA) {
      uVar9 = (ulong)(sVar6 == STBIR_TYPE_UINT16) << 4;
      papsVar12 = stbir__update_info_from_resize::encode_simple_scaled_or_not;
    }
    else {
      uVar9 = (ulong)(((info->output_pixel_layout_internal - STBIRI_RGBA) % 6) * 0x20);
      papsVar12 = stbir__update_info_from_resize::encode_alphas_scaled_or_not[0] +
                  (sVar6 == STBIR_TYPE_UINT16);
    }
    ppsVar10 = (stbir__encode_pixels_func **)((long)*papsVar12 + uVar7 * 8 + uVar9);
  }
  else if (info->output_pixel_layout_internal < STBIRI_RGBA) {
    ppsVar10 = stbir__update_info_from_resize::encode_simple + (sVar6 - STBIR_TYPE_UINT8_SRGB);
  }
  else {
    ppsVar10 = stbir__update_info_from_resize::encode_alphas
               [(info->output_pixel_layout_internal - STBIRI_RGBA) % 6] +
               (sVar6 - STBIR_TYPE_UINT8_SRGB);
  }
  psVar4 = *ppsVar10;
  info->input_type = sVar5;
  info->output_type = sVar6;
  info->decode_pixels = psVar3;
  info->encode_pixels = psVar4;
  return;
}

Assistant:

static void stbir__update_info_from_resize( stbir__info * info, STBIR_RESIZE * resize )
{
  static stbir__decode_pixels_func * decode_simple[STBIR_TYPE_HALF_FLOAT-STBIR_TYPE_UINT8_SRGB+1]=
  {
    /* 1ch-4ch */ stbir__decode_uint8_srgb, stbir__decode_uint8_srgb, 0, stbir__decode_float_linear, stbir__decode_half_float_linear,
  };

  static stbir__decode_pixels_func * decode_alphas[STBIRI_AR-STBIRI_RGBA+1][STBIR_TYPE_HALF_FLOAT-STBIR_TYPE_UINT8_SRGB+1]=
  {
    { /* RGBA */ stbir__decode_uint8_srgb4_linearalpha,      stbir__decode_uint8_srgb,      0, stbir__decode_float_linear,      stbir__decode_half_float_linear },
    { /* BGRA */ stbir__decode_uint8_srgb4_linearalpha_BGRA, stbir__decode_uint8_srgb_BGRA, 0, stbir__decode_float_linear_BGRA, stbir__decode_half_float_linear_BGRA },
    { /* ARGB */ stbir__decode_uint8_srgb4_linearalpha_ARGB, stbir__decode_uint8_srgb_ARGB, 0, stbir__decode_float_linear_ARGB, stbir__decode_half_float_linear_ARGB },
    { /* ABGR */ stbir__decode_uint8_srgb4_linearalpha_ABGR, stbir__decode_uint8_srgb_ABGR, 0, stbir__decode_float_linear_ABGR, stbir__decode_half_float_linear_ABGR },
    { /* RA   */ stbir__decode_uint8_srgb2_linearalpha,      stbir__decode_uint8_srgb,      0, stbir__decode_float_linear,      stbir__decode_half_float_linear },
    { /* AR   */ stbir__decode_uint8_srgb2_linearalpha_AR,   stbir__decode_uint8_srgb_AR,   0, stbir__decode_float_linear_AR,   stbir__decode_half_float_linear_AR },
  };

  static stbir__decode_pixels_func * decode_simple_scaled_or_not[2][2]=
  {
    { stbir__decode_uint8_linear_scaled,  stbir__decode_uint8_linear }, { stbir__decode_uint16_linear_scaled, stbir__decode_uint16_linear },
  };

  static stbir__decode_pixels_func * decode_alphas_scaled_or_not[STBIRI_AR-STBIRI_RGBA+1][2][2]=
  {
    { /* RGBA */ { stbir__decode_uint8_linear_scaled,       stbir__decode_uint8_linear },      { stbir__decode_uint16_linear_scaled,      stbir__decode_uint16_linear } },
    { /* BGRA */ { stbir__decode_uint8_linear_scaled_BGRA,  stbir__decode_uint8_linear_BGRA }, { stbir__decode_uint16_linear_scaled_BGRA, stbir__decode_uint16_linear_BGRA } },
    { /* ARGB */ { stbir__decode_uint8_linear_scaled_ARGB,  stbir__decode_uint8_linear_ARGB }, { stbir__decode_uint16_linear_scaled_ARGB, stbir__decode_uint16_linear_ARGB } },
    { /* ABGR */ { stbir__decode_uint8_linear_scaled_ABGR,  stbir__decode_uint8_linear_ABGR }, { stbir__decode_uint16_linear_scaled_ABGR, stbir__decode_uint16_linear_ABGR } },
    { /* RA   */ { stbir__decode_uint8_linear_scaled,       stbir__decode_uint8_linear },      { stbir__decode_uint16_linear_scaled,      stbir__decode_uint16_linear } },
    { /* AR   */ { stbir__decode_uint8_linear_scaled_AR,    stbir__decode_uint8_linear_AR },   { stbir__decode_uint16_linear_scaled_AR,   stbir__decode_uint16_linear_AR } }
  };

  static stbir__encode_pixels_func * encode_simple[STBIR_TYPE_HALF_FLOAT-STBIR_TYPE_UINT8_SRGB+1]=
  {
    /* 1ch-4ch */ stbir__encode_uint8_srgb, stbir__encode_uint8_srgb, 0, stbir__encode_float_linear, stbir__encode_half_float_linear,
  };

  static stbir__encode_pixels_func * encode_alphas[STBIRI_AR-STBIRI_RGBA+1][STBIR_TYPE_HALF_FLOAT-STBIR_TYPE_UINT8_SRGB+1]=
  {
    { /* RGBA */ stbir__encode_uint8_srgb4_linearalpha,      stbir__encode_uint8_srgb,      0, stbir__encode_float_linear,      stbir__encode_half_float_linear },
    { /* BGRA */ stbir__encode_uint8_srgb4_linearalpha_BGRA, stbir__encode_uint8_srgb_BGRA, 0, stbir__encode_float_linear_BGRA, stbir__encode_half_float_linear_BGRA },
    { /* ARGB */ stbir__encode_uint8_srgb4_linearalpha_ARGB, stbir__encode_uint8_srgb_ARGB, 0, stbir__encode_float_linear_ARGB, stbir__encode_half_float_linear_ARGB },
    { /* ABGR */ stbir__encode_uint8_srgb4_linearalpha_ABGR, stbir__encode_uint8_srgb_ABGR, 0, stbir__encode_float_linear_ABGR, stbir__encode_half_float_linear_ABGR },
    { /* RA   */ stbir__encode_uint8_srgb2_linearalpha,      stbir__encode_uint8_srgb,      0, stbir__encode_float_linear,      stbir__encode_half_float_linear },
    { /* AR   */ stbir__encode_uint8_srgb2_linearalpha_AR,   stbir__encode_uint8_srgb_AR,   0, stbir__encode_float_linear_AR,   stbir__encode_half_float_linear_AR }
  };

  static stbir__encode_pixels_func * encode_simple_scaled_or_not[2][2]=
  {
    { stbir__encode_uint8_linear_scaled,  stbir__encode_uint8_linear }, { stbir__encode_uint16_linear_scaled, stbir__encode_uint16_linear },
  };

  static stbir__encode_pixels_func * encode_alphas_scaled_or_not[STBIRI_AR-STBIRI_RGBA+1][2][2]=
  {
    { /* RGBA */ { stbir__encode_uint8_linear_scaled,       stbir__encode_uint8_linear },       { stbir__encode_uint16_linear_scaled,      stbir__encode_uint16_linear } },
    { /* BGRA */ { stbir__encode_uint8_linear_scaled_BGRA,  stbir__encode_uint8_linear_BGRA },  { stbir__encode_uint16_linear_scaled_BGRA, stbir__encode_uint16_linear_BGRA } },
    { /* ARGB */ { stbir__encode_uint8_linear_scaled_ARGB,  stbir__encode_uint8_linear_ARGB },  { stbir__encode_uint16_linear_scaled_ARGB, stbir__encode_uint16_linear_ARGB } },
    { /* ABGR */ { stbir__encode_uint8_linear_scaled_ABGR,  stbir__encode_uint8_linear_ABGR },  { stbir__encode_uint16_linear_scaled_ABGR, stbir__encode_uint16_linear_ABGR } },
    { /* RA   */ { stbir__encode_uint8_linear_scaled,       stbir__encode_uint8_linear },       { stbir__encode_uint16_linear_scaled,      stbir__encode_uint16_linear } },
    { /* AR   */ { stbir__encode_uint8_linear_scaled_AR,    stbir__encode_uint8_linear_AR },    { stbir__encode_uint16_linear_scaled_AR,   stbir__encode_uint16_linear_AR } }
  };

  stbir__decode_pixels_func * decode_pixels = 0;
  stbir__encode_pixels_func * encode_pixels = 0;
  stbir_datatype input_type, output_type;

  input_type = resize->input_data_type;
  output_type = resize->output_data_type;
  info->input_data = resize->input_pixels;
  info->input_stride_bytes = resize->input_stride_in_bytes;
  info->output_stride_bytes = resize->output_stride_in_bytes;

  // if we're completely point sampling, then we can turn off SRGB
  if ( ( info->horizontal.filter_enum == STBIR_FILTER_POINT_SAMPLE ) && ( info->vertical.filter_enum == STBIR_FILTER_POINT_SAMPLE ) )
  {
    if ( ( ( input_type  == STBIR_TYPE_UINT8_SRGB ) || ( input_type  == STBIR_TYPE_UINT8_SRGB_ALPHA ) ) &&
         ( ( output_type == STBIR_TYPE_UINT8_SRGB ) || ( output_type == STBIR_TYPE_UINT8_SRGB_ALPHA ) ) )
    {
      input_type = STBIR_TYPE_UINT8;
      output_type = STBIR_TYPE_UINT8;
    }
  }

  // recalc the output and input strides
  if ( info->input_stride_bytes == 0 )
    info->input_stride_bytes = info->channels * info->horizontal.scale_info.input_full_size * stbir__type_size[input_type];

  if ( info->output_stride_bytes == 0 )
    info->output_stride_bytes = info->channels * info->horizontal.scale_info.output_sub_size * stbir__type_size[output_type];

  // calc offset
  info->output_data = ( (char*) resize->output_pixels ) + ( (size_t) info->offset_y * (size_t) resize->output_stride_in_bytes ) + ( info->offset_x * info->channels * stbir__type_size[output_type] );

  info->in_pixels_cb = resize->input_cb;
  info->user_data = resize->user_data;
  info->out_pixels_cb = resize->output_cb;

  // setup the input format converters
  if ( ( input_type == STBIR_TYPE_UINT8 ) || ( input_type == STBIR_TYPE_UINT16 ) )
  {
    int non_scaled = 0;

    // check if we can run unscaled - 0-255.0/0-65535.0 instead of 0-1.0 (which is a tiny bit faster when doing linear 8->8 or 16->16)
    if ( ( !info->alpha_weight ) && ( !info->alpha_unweight )  ) // don't short circuit when alpha weighting (get everything to 0-1.0 as usual)
      if ( ( ( input_type == STBIR_TYPE_UINT8 ) && ( output_type == STBIR_TYPE_UINT8 ) ) || ( ( input_type == STBIR_TYPE_UINT16 ) && ( output_type == STBIR_TYPE_UINT16 ) ) )
        non_scaled = 1;

    if ( info->input_pixel_layout_internal <= STBIRI_4CHANNEL )
      decode_pixels = decode_simple_scaled_or_not[ input_type == STBIR_TYPE_UINT16 ][ non_scaled ];
    else
      decode_pixels = decode_alphas_scaled_or_not[ ( info->input_pixel_layout_internal - STBIRI_RGBA ) % ( STBIRI_AR-STBIRI_RGBA+1 ) ][ input_type == STBIR_TYPE_UINT16 ][ non_scaled ];
  }
  else
  {
    if ( info->input_pixel_layout_internal <= STBIRI_4CHANNEL )
      decode_pixels = decode_simple[ input_type - STBIR_TYPE_UINT8_SRGB ];
    else
      decode_pixels = decode_alphas[ ( info->input_pixel_layout_internal - STBIRI_RGBA ) % ( STBIRI_AR-STBIRI_RGBA+1 ) ][ input_type - STBIR_TYPE_UINT8_SRGB ];
  }

  // setup the output format converters
  if ( ( output_type == STBIR_TYPE_UINT8 ) || ( output_type == STBIR_TYPE_UINT16 ) )
  {
    int non_scaled = 0;

    // check if we can run unscaled - 0-255.0/0-65535.0 instead of 0-1.0 (which is a tiny bit faster when doing linear 8->8 or 16->16)
    if ( ( !info->alpha_weight ) && ( !info->alpha_unweight ) ) // don't short circuit when alpha weighting (get everything to 0-1.0 as usual)
      if ( ( ( input_type == STBIR_TYPE_UINT8 ) && ( output_type == STBIR_TYPE_UINT8 ) ) || ( ( input_type == STBIR_TYPE_UINT16 ) && ( output_type == STBIR_TYPE_UINT16 ) ) )
        non_scaled = 1;

    if ( info->output_pixel_layout_internal <= STBIRI_4CHANNEL )
      encode_pixels = encode_simple_scaled_or_not[ output_type == STBIR_TYPE_UINT16 ][ non_scaled ];
    else
      encode_pixels = encode_alphas_scaled_or_not[ ( info->output_pixel_layout_internal - STBIRI_RGBA ) % ( STBIRI_AR-STBIRI_RGBA+1 ) ][ output_type == STBIR_TYPE_UINT16 ][ non_scaled ];
  }
  else
  {
    if ( info->output_pixel_layout_internal <= STBIRI_4CHANNEL )
      encode_pixels = encode_simple[ output_type - STBIR_TYPE_UINT8_SRGB ];
    else
      encode_pixels = encode_alphas[ ( info->output_pixel_layout_internal - STBIRI_RGBA ) % ( STBIRI_AR-STBIRI_RGBA+1 ) ][ output_type - STBIR_TYPE_UINT8_SRGB ];
  }

  info->input_type = input_type;
  info->output_type = output_type;
  info->decode_pixels = decode_pixels;
  info->encode_pixels = encode_pixels;
}